

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::TapAssertionPrinter
          (TapAssertionPrinter *this,ostream *_stream,AssertionStats *_stats,size_t _counter,
          ColourImpl *colour_)

{
  const_iterator cVar1;
  ColourImpl *colour__local;
  size_t _counter_local;
  AssertionStats *_stats_local;
  ostream *_stream_local;
  TapAssertionPrinter *this_local;
  
  this->stream = _stream;
  this->result = &_stats->assertionResult;
  this->messages = &_stats->infoMessages;
  cVar1 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                    (&_stats->infoMessages);
  (this->itMessage)._M_current = cVar1._M_current;
  this->printInfoMessages = true;
  this->counter = _counter;
  this->colourImpl = colour_;
  return;
}

Assistant:

TapAssertionPrinter(std::ostream& _stream, AssertionStats const& _stats, std::size_t _counter, ColourImpl* colour_)
                : stream(_stream)
                , result(_stats.assertionResult)
                , messages(_stats.infoMessages)
                , itMessage(_stats.infoMessages.begin())
                , printInfoMessages(true)
                , counter(_counter)
                , colourImpl( colour_ ) {}